

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O2

Bool handle_compress(bz_stream *strm)

{
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  byte bVar6;
  EState *s;
  bool bVar7;
  bool bVar8;
  Int32 IVar9;
  int iVar10;
  UChar ch;
  int iVar11;
  bz_stream *pbVar12;
  uint uVar13;
  int iVar14;
  bool is_last_block;
  
  s = (EState *)strm->state;
  bVar7 = false;
  bVar8 = false;
LAB_001091da:
  do {
    do {
      if (s->state == 2) goto LAB_001092a3;
    } while (s->state != 1);
    pbVar12 = s->strm;
    uVar13 = pbVar12->avail_out;
    IVar9 = s->state_out_pos;
    bVar6 = 0;
    while ((uVar13 != 0 && (IVar9 < s->numZ))) {
      *pbVar12->next_out = s->zbits[IVar9];
      IVar9 = s->state_out_pos + 1;
      s->state_out_pos = IVar9;
      pbVar12 = s->strm;
      uVar13 = pbVar12->avail_out - 1;
      pbVar12->avail_out = uVar13;
      pbVar12->next_out = pbVar12->next_out + 1;
      bVar6 = 1;
      puVar1 = &pbVar12->total_out_lo32;
      *puVar1 = *puVar1 + 1;
      if (*puVar1 == 0) {
        pbVar12->total_out_hi32 = pbVar12->total_out_hi32 + 1;
      }
    }
    bVar7 = (bool)(bVar6 | bVar7);
    if ((IVar9 < s->numZ) ||
       (((s->mode == 4 && (s->avail_in_expect == 0)) &&
        ((0xff < s->state_in_ch || (s->state_in_len < 1)))))) goto LAB_001094ca;
    prepare_new_block(s);
    s->state = 2;
    IVar9 = s->mode;
    if (IVar9 == 3) {
      if ((s->avail_in_expect == 0) && ((0xff < s->state_in_ch || (s->state_in_len < 1))))
      goto LAB_001094ca;
LAB_001092a3:
      IVar9 = s->mode;
    }
    bVar6 = 0;
    if (IVar9 == 2) {
      while( true ) {
        iVar10 = s->nblock;
        iVar14 = s->nblockMAX;
        if ((iVar14 <= iVar10) || (s->strm->avail_in == 0)) break;
        bVar6 = *s->strm->next_in;
        uVar13 = s->state_in_ch;
        iVar14 = s->state_in_len;
        if (uVar13 == bVar6) {
          if (iVar14 == 0xff) {
LAB_00109341:
            add_pair_to_block(s);
LAB_00109351:
            s->state_in_ch = (uint)bVar6;
            s->state_in_len = 1;
          }
          else {
            s->state_in_len = iVar14 + 1;
          }
        }
        else {
          if (iVar14 != 1) {
            if (uVar13 < 0x100) goto LAB_00109341;
            goto LAB_00109351;
          }
          s->blockCRC = s->blockCRC << 8 ^ BZ2_crc32Table[uVar13 & 0xff ^ s->blockCRC >> 0x18];
          s->inUse[uVar13] = '\x01';
          s->block[iVar10] = (UChar)uVar13;
          s->nblock = s->nblock + 1;
          s->state_in_ch = (uint)bVar6;
        }
        pbVar12 = s->strm;
        pbVar12->next_in = pbVar12->next_in + 1;
        uVar2 = pbVar12->avail_in;
        uVar4 = pbVar12->total_in_lo32;
        pbVar12->avail_in = uVar2 + -1;
        pbVar12->total_in_lo32 = uVar4 + 1;
        bVar6 = 1;
        if (uVar4 + 1 == 0) {
          pbVar12->total_in_hi32 = pbVar12->total_in_hi32 + 1;
        }
      }
    }
    else {
      while( true ) {
        iVar10 = s->nblock;
        iVar14 = s->nblockMAX;
        if (((iVar14 <= iVar10) || (s->strm->avail_in == 0)) || (s->avail_in_expect == 0)) break;
        bVar6 = *s->strm->next_in;
        uVar13 = s->state_in_ch;
        iVar14 = s->state_in_len;
        if (uVar13 == bVar6) {
          if (iVar14 == 0xff) {
LAB_00109415:
            add_pair_to_block(s);
LAB_00109425:
            s->state_in_ch = (uint)bVar6;
            s->state_in_len = 1;
          }
          else {
            s->state_in_len = iVar14 + 1;
          }
        }
        else {
          if (iVar14 != 1) {
            if (uVar13 < 0x100) goto LAB_00109415;
            goto LAB_00109425;
          }
          s->blockCRC = s->blockCRC << 8 ^ BZ2_crc32Table[uVar13 & 0xff ^ s->blockCRC >> 0x18];
          s->inUse[uVar13] = '\x01';
          s->block[iVar10] = (UChar)uVar13;
          s->nblock = s->nblock + 1;
          s->state_in_ch = (uint)bVar6;
        }
        pbVar12 = s->strm;
        pbVar12->next_in = pbVar12->next_in + 1;
        uVar3 = pbVar12->avail_in;
        uVar5 = pbVar12->total_in_lo32;
        pbVar12->avail_in = uVar3 + -1;
        pbVar12->total_in_lo32 = uVar5 + 1;
        if (uVar5 + 1 == 0) {
          pbVar12->total_in_hi32 = pbVar12->total_in_hi32 + 1;
        }
        s->avail_in_expect = s->avail_in_expect - 1;
        bVar6 = 1;
      }
    }
    bVar8 = (bool)(bVar8 | bVar6);
    iVar11 = s->mode;
    if ((iVar11 == 2) || (s->avail_in_expect != 0)) break;
    if (s->state_in_ch < 0x100) {
      add_pair_to_block(s);
      iVar11 = s->mode;
    }
    s->state_in_ch = 0x100;
    s->state_in_len = 0;
    is_last_block = iVar11 == 4;
LAB_001094a8:
    BZ2_compressBlock(s,is_last_block);
    s->state = 1;
  } while( true );
  if (iVar14 <= iVar10) {
    is_last_block = false;
    goto LAB_001094a8;
  }
  if (s->strm->avail_in == 0) {
LAB_001094ca:
    return bVar7 || bVar8;
  }
  goto LAB_001091da;
}

Assistant:

static
Bool handle_compress ( bz_stream* strm )
{
   Bool progress_in  = False;
   Bool progress_out = False;
   EState* s = strm->state;

   while (True) {

      if (s->state == BZ_S_OUTPUT) {
         progress_out |= copy_output_until_stop ( s );
         if (s->state_out_pos < s->numZ) break;
         if (s->mode == BZ_M_FINISHING &&
             s->avail_in_expect == 0 &&
             isempty_RL(s)) break;
         prepare_new_block ( s );
         s->state = BZ_S_INPUT;
         if (s->mode == BZ_M_FLUSHING &&
             s->avail_in_expect == 0 &&
             isempty_RL(s)) break;
      }

      if (s->state == BZ_S_INPUT) {
         progress_in |= copy_input_until_stop ( s );
         if (s->mode != BZ_M_RUNNING && s->avail_in_expect == 0) {
            flush_RL ( s );
            BZ2_compressBlock ( s, (Bool)(s->mode == BZ_M_FINISHING) );
            s->state = BZ_S_OUTPUT;
         }
         else
         if (s->nblock >= s->nblockMAX) {
            BZ2_compressBlock ( s, False );
            s->state = BZ_S_OUTPUT;
         }
         else
         if (s->strm->avail_in == 0) {
            break;
         }
      }

   }

   return progress_in || progress_out;
}